

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

bool duckdb::ApproxQuantileCoding::Decode<double,duckdb::dtime_tz_t>
               (double *source,dtime_tz_t *target)

{
  bool bVar1;
  dtime_tz_t dVar2;
  LogicalType LStack_78;
  uint64_t sort_key;
  Value local_58;
  
  bVar1 = Decode<double,unsigned_long>(source,&sort_key);
  if (bVar1) {
    target->bits = (ulong)((uint)sort_key & 0xffffff) * -0xf4240000000 + sort_key;
  }
  else {
    if (0.0 < *source || *source == 0.0) {
      LogicalType::LogicalType(&LStack_78,TIME_TZ);
      Value::MaximumValue(&local_58,&LStack_78);
      dVar2 = Value::GetValue<duckdb::dtime_tz_t>(&local_58);
    }
    else {
      LogicalType::LogicalType(&LStack_78,TIME_TZ);
      Value::MinimumValue(&local_58,&LStack_78);
      dVar2 = Value::GetValue<duckdb::dtime_tz_t>(&local_58);
    }
    target->bits = (uint64_t)dVar2;
    Value::~Value(&local_58);
    LogicalType::~LogicalType(&LStack_78);
  }
  return bVar1;
}

Assistant:

bool ApproxQuantileCoding::Decode(const double &source, dtime_tz_t &target) {
	uint64_t sort_key;
	const auto decoded = Decode<double, uint64_t>(source, sort_key);
	if (decoded) {
		//	We can invert the sort key because its offset was not touched.
		auto offset = dtime_tz_t::decode_offset(sort_key);
		auto micros = dtime_tz_t::decode_micros(sort_key);
		micros -= int64_t(dtime_tz_t::encode_offset(offset) * dtime_tz_t::OFFSET_MICROS);
		target = dtime_tz_t(dtime_t(micros), offset);
	} else if (source < 0) {
		target = Value::MinimumValue(LogicalTypeId::TIME_TZ).GetValue<dtime_tz_t>();
	} else {
		target = Value::MaximumValue(LogicalTypeId::TIME_TZ).GetValue<dtime_tz_t>();
	}

	return decoded;
}